

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O3

void Imf_2_5::loadDeepScanLineImage(string *fileName,Header *hdr,DeepImage *img)

{
  SampleCountChannel *this;
  char *fileName_00;
  int iVar1;
  Header *pHVar2;
  ChannelList *this_00;
  const_iterator cVar3;
  ConstIterator CVar4;
  Box2i *pBVar5;
  DeepImageLevel *this_01;
  iterator iVar6;
  Iterator IVar7;
  const_iterator cVar8;
  ConstIterator CVar9;
  undefined1 in_R10B;
  DeepScanLineInputFile in;
  DeepFrameBuffer fb;
  Slice local_68;
  undefined4 extraout_var;
  
  fileName_00 = (fileName->_M_dataplus)._M_p;
  iVar1 = globalThreadCount();
  DeepScanLineInputFile::DeepScanLineInputFile(&in,fileName_00,iVar1);
  pHVar2 = DeepScanLineInputFile::header(&in);
  this_00 = Header::channels(pHVar2);
  Image::clearChannels(&img->super_Image);
  cVar3._M_node = (_Base_ptr)ChannelList::begin(this_00);
  while( true ) {
    CVar4 = ChannelList::end(this_00);
    if ((const_iterator)cVar3._M_node == CVar4._i._M_node) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fb,(char *)(cVar3._M_node + 1),(allocator<char> *)&local_68);
    Image::insertChannel(&img->super_Image,(string *)&fb,(Channel *)(cVar3._M_node + 9));
    if ((_Base_ptr *)fb._map._M_t._M_impl._0_8_ !=
        &fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)fb._map._M_t._M_impl._0_8_,
                      (ulong)((long)&(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                     )->_M_color + 1));
    }
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  }
  pHVar2 = DeepScanLineInputFile::header(&in);
  pBVar5 = Header::dataWindow(pHVar2);
  (*(img->super_Image)._vptr_Image[2])(img,pBVar5,0);
  iVar1 = (*(img->super_Image)._vptr_Image[3])(img,0);
  this_01 = (DeepImageLevel *)CONCAT44(extraout_var,iVar1);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Slice::Slice(&fb._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
               SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
  this = &this_01->_sampleCounts;
  SampleCountChannel::slice(&local_68,this);
  DeepFrameBuffer::insertSampleCountSlice(&fb,&local_68);
  iVar6._M_node = (_Base_ptr)DeepImageLevel::begin(this_01);
  while( true ) {
    IVar7 = DeepImageLevel::end(this_01);
    if ((iterator)iVar6._M_node == IVar7._i._M_node) break;
    (**(code **)(**(long **)(iVar6._M_node + 2) + 0x20))(&local_68);
    DeepFrameBuffer::insert(&fb,(string *)(iVar6._M_node + 1),(DeepSlice *)&local_68);
    iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node);
  }
  DeepScanLineInputFile::setFrameBuffer(&in,&fb);
  SampleCountChannel::beginEdit(this);
  DeepScanLineInputFile::readPixelSampleCounts
            (&in,(this_01->super_ImageLevel)._dataWindow.min.y,
             (this_01->super_ImageLevel)._dataWindow.max.y);
  SampleCountChannel::endEdit(this);
  DeepScanLineInputFile::readPixels
            (&in,(this_01->super_ImageLevel)._dataWindow.min.y,
             (this_01->super_ImageLevel)._dataWindow.max.y);
  pHVar2 = DeepScanLineInputFile::header(&in);
  cVar8._M_node = (_Base_ptr)Header::begin(pHVar2);
  while( true ) {
    pHVar2 = DeepScanLineInputFile::header(&in);
    CVar9 = Header::end(pHVar2);
    if ((const_iterator)cVar8._M_node == CVar9._i._M_node) break;
    iVar1 = strcmp((char *)(cVar8._M_node + 1),"tiles");
    if (iVar1 != 0) {
      Header::insert(hdr,(char *)(cVar8._M_node + 1),*(Attribute **)(cVar8._M_node + 9));
    }
    cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node);
  }
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&fb);
  DeepScanLineInputFile::~DeepScanLineInputFile(&in);
  return;
}

Assistant:

void
loadDeepScanLineImage
    (const string &fileName,
     Header &hdr,
     DeepImage &img)
{
    DeepScanLineInputFile in (fileName.c_str());

    const ChannelList &cl = in.header().channels();

    img.clearChannels();

    for (ChannelList::ConstIterator i = cl.begin(); i != cl.end(); ++i)
        img.insertChannel (i.name(), i.channel());

    img.resize (in.header().dataWindow(), ONE_LEVEL, ROUND_DOWN);

    DeepImageLevel &level = img.level();
    DeepFrameBuffer fb;

    fb.insertSampleCountSlice (level.sampleCounts().slice());

    for (DeepImageLevel::ConstIterator i = level.begin(); i != level.end(); ++i)
        fb.insert (i.name(), i.channel().slice());

    in.setFrameBuffer (fb);

    {
        SampleCountChannel::Edit edit (level.sampleCounts());

        in.readPixelSampleCounts
            (level.dataWindow().min.y, level.dataWindow().max.y);
    }

    in.readPixels (level.dataWindow().min.y, level.dataWindow().max.y);

    for (Header::ConstIterator i = in.header().begin();
         i != in.header().end();
         ++i)
    {
        if (strcmp (i.name(), "tiles"))
            hdr.insert (i.name(), i.attribute());
    }
}